

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

bool __thiscall FIX::Session::doTargetTooLow(Session *this,Message *msg)

{
  bool bVar1;
  MsgSeqNum *pMVar2;
  ostream *poVar3;
  logic_error *this_00;
  string sStack_228;
  PossDupFlag possDupFlag;
  stringstream stream;
  ostream local_1a0 [376];
  
  stream = (stringstream)0x0;
  PossDupFlag::PossDupFlag(&possDupFlag,(BOOLEAN *)&stream);
  FieldMap::getFieldIfSet(&(msg->m_header).super_FieldMap,(FieldBase *)&possDupFlag);
  pMVar2 = FieldMap::getField<FIX::MsgSeqNum>(&(msg->m_header).super_FieldMap);
  bVar1 = BoolField::getValue(&possDupFlag.super_BoolField);
  if (bVar1) {
    bVar1 = doPossDup(this,msg);
    FieldBase::~FieldBase((FieldBase *)&possDupFlag);
    return bVar1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  poVar3 = std::operator<<(local_1a0,"MsgSeqNum too low, expecting ");
  SessionState::getNextTargetMsgSeqNum(&this->m_state);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," but received ");
  std::operator<<(poVar3,(string *)&(pMVar2->super_SeqNumField).super_FieldBase.m_string);
  std::__cxx11::stringbuf::str();
  generateLogout(this,&sStack_228);
  std::__cxx11::string::~string((string *)&sStack_228);
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::logic_error::logic_error(this_00,(string *)&sStack_228);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

bool Session::doTargetTooLow(const Message &msg) {
  const Header &header = msg.getHeader();
  PossDupFlag possDupFlag(false);
  header.getFieldIfSet(possDupFlag);
  auto const &msgSeqNum = header.getField<MsgSeqNum>();

  if (!possDupFlag) {
    std::stringstream stream;
    stream << "MsgSeqNum too low, expecting " << getExpectedTargetNum() << " but received " << msgSeqNum;
    generateLogout(stream.str());
    throw std::logic_error(stream.str());
  }

  return doPossDup(msg);
}